

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

void __thiscall TypeOpStore::printRaw(TypeOpStore *this,ostream *s,PcodeOp *op)

{
  ostream *poVar1;
  
  std::operator<<(s,"*(");
  poVar1 = std::operator<<(s,(string *)
                             (((*(op->inrefs).
                                 super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                                 super__Vector_impl_data._M_start)->loc).offset + 0x38));
  std::operator<<(poVar1,',');
  Varnode::printRaw((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                    super__Vector_impl_data._M_start[1],s);
  std::operator<<(s,") = ");
  Varnode::printRaw((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                    super__Vector_impl_data._M_start[2],s);
  return;
}

Assistant:

void TypeOpStore::printRaw(ostream &s,const PcodeOp *op)

{
  s << "*(";
  AddrSpace *spc = Address::getSpaceFromConst(op->getIn(0)->getAddr());
  s << spc->getName() << ',';
  op->getIn(1)->printRaw(s);
  s << ") = ";
  op->getIn(2)->printRaw(s);
}